

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsequentialanimationgroup.cpp
# Opt level: O2

void __thiscall
QSequentialAnimationGroup::updateDirection(QSequentialAnimationGroup *this,Direction direction)

{
  long lVar1;
  State SVar2;
  parameter_type pQVar3;
  QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
  *this_00;
  
  lVar1 = *(long *)(this + 8);
  SVar2 = QAbstractAnimation::state((QAbstractAnimation *)this);
  if (SVar2 != Stopped) {
    this_00 = (QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
               *)(lVar1 + 0xb8);
    pQVar3 = QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
             ::value(this_00);
    if (pQVar3 != (parameter_type)0x0) {
      QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
      ::value(this_00);
      QAbstractAnimation::setDirection
                ((QAbstractAnimation *)(this_00->super_QPropertyData<QAbstractAnimation_*>).val,
                 direction);
      return;
    }
  }
  return;
}

Assistant:

void QSequentialAnimationGroup::updateDirection(QAbstractAnimation::Direction direction)
{
    Q_D(QSequentialAnimationGroup);
    // we need to update the direction of the current animation
    if (state() != Stopped && d->currentAnimation)
        d->currentAnimation->setDirection(direction);
}